

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall tinyusdz::PrimMetas::authored(PrimMetas *this)

{
  if ((((((((this->active).has_value_ == false) && ((this->hidden).has_value_ == false)) &&
         ((this->kind).has_value_ == false)) &&
        (((this->customData).has_value_ == false && ((this->references).has_value_ == false)))) &&
       ((((this->payload).has_value_ == false &&
         (((this->inherits).has_value_ == false && ((this->variants).has_value_ == false)))) &&
        ((this->variantSets).has_value_ == false)))) &&
      (((((this->specializes).has_value_ == false && ((this->displayName).has_value_ == false)) &&
        ((this->sceneName).has_value_ == false)) &&
       ((((this->doc).has_value_ == false && ((this->comment).has_value_ == false)) &&
        (((this->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
         (((this->meta)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
          ((this->apiSchemas).has_value_ == false)))))))))) &&
     (((this->sdrMetadata).has_value_ == false &&
      (((this->assetInfo).has_value_ == false && ((this->instanceable).has_value_ == false)))))) {
    return (this->clips).has_value_;
  }
  return true;
}

Assistant:

bool authored() const {
    return (active || hidden || kind || customData || references || payload ||
            inherits || variants || variantSets || specializes || displayName ||
            sceneName || doc || comment || unregisteredMetas.size() || meta.size() || apiSchemas ||
            sdrMetadata || assetInfo || instanceable || clips);
  }